

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::shiftLeft(DecimalQuantity *this,int32_t numDigits)

{
  int local_18;
  int i;
  int32_t numDigits_local;
  DecimalQuantity *this_local;
  
  if (((this->usingBytes & 1U) == 0) && (0x10 < this->precision + numDigits)) {
    switchStorage(this);
  }
  if ((this->usingBytes & 1U) == 0) {
    (this->fBCD).bcdLong = (this->fBCD).bcdLong << ((byte)(numDigits << 2) & 0x3f);
  }
  else {
    ensureCapacity(this,this->precision + numDigits);
    local_18 = this->precision + numDigits;
    while (local_18 = local_18 + -1, numDigits <= local_18) {
      (this->fBCD).bcdBytes.ptr[local_18] = (this->fBCD).bcdBytes.ptr[local_18 - numDigits];
    }
    for (; -1 < local_18; local_18 = local_18 + -1) {
      (this->fBCD).bcdBytes.ptr[local_18] = '\0';
    }
  }
  this->scale = this->scale - numDigits;
  this->precision = numDigits + this->precision;
  return;
}

Assistant:

void DecimalQuantity::shiftLeft(int32_t numDigits) {
    if (!usingBytes && precision + numDigits > 16) {
        switchStorage();
    }
    if (usingBytes) {
        ensureCapacity(precision + numDigits);
        int i = precision + numDigits - 1;
        for (; i >= numDigits; i--) {
            fBCD.bcdBytes.ptr[i] = fBCD.bcdBytes.ptr[i - numDigits];
        }
        for (; i >= 0; i--) {
            fBCD.bcdBytes.ptr[i] = 0;
        }
    } else {
        fBCD.bcdLong <<= (numDigits * 4);
    }
    scale -= numDigits;
    precision += numDigits;
}